

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture2D_GL.cpp
# Opt level: O2

void __thiscall
Diligent::Texture2D_GL::AttachToFramebuffer
          (Texture2D_GL *this,TextureViewDesc *ViewDesc,GLenum AttachmentPoint,
          FRAMEBUFFER_TARGET_FLAGS Targets)

{
  undefined4 in_register_0000000c;
  GLenum err;
  string msg;
  uint local_54;
  string local_50;
  
  if ((Targets & FRAMEBUFFER_TARGET_FLAG_DRAW) != FRAMEBUFFER_TARGET_FLAG_NONE) {
    if ((ViewDesc->ViewType & ~TEXTURE_VIEW_SHADER_RESOURCE) != TEXTURE_VIEW_RENDER_TARGET) {
      FormatString<char[26],char[99]>
                (&local_50,(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])
                 "ViewDesc.ViewType == TEXTURE_VIEW_RENDER_TARGET || ViewDesc.ViewType == TEXTURE_VIEW_DEPTH_STENCIL"
                 ,(char (*) [99])CONCAT44(in_register_0000000c,Targets));
      DebugAssertionFailed
                (local_50._M_dataplus._M_p,"AttachToFramebuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/Texture2D_GL.cpp"
                 ,0x11c);
      std::__cxx11::string::~string((string *)&local_50);
    }
    (*__glewFramebufferTexture2D)
              (0x8ca9,AttachmentPoint,(this->super_TextureBaseGL).m_BindTarget,
               (this->super_TextureBaseGL).m_GlTexture.m_uiHandle,ViewDesc->MostDetailedMip);
    local_54 = glGetError();
    if (local_54 != 0) {
      LogError<false,char[48],char[17],unsigned_int>
                (false,"AttachToFramebuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/Texture2D_GL.cpp"
                 ,0x11e,(char (*) [48])"Failed to attach texture 2D to draw framebuffer",
                 (char (*) [17])"\nGL Error Code: ",&local_54);
      FormatString<char[6]>(&local_50,(char (*) [6])0x731c01);
      DebugAssertionFailed
                (local_50._M_dataplus._M_p,"AttachToFramebuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/Texture2D_GL.cpp"
                 ,0x11e);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  if ((Targets & FRAMEBUFFER_TARGET_FLAG_READ) != FRAMEBUFFER_TARGET_FLAG_NONE) {
    (*__glewFramebufferTexture2D)
              (0x8ca8,AttachmentPoint,(this->super_TextureBaseGL).m_BindTarget,
               (this->super_TextureBaseGL).m_GlTexture.m_uiHandle,ViewDesc->MostDetailedMip);
    local_54 = glGetError();
    if (local_54 != 0) {
      LogError<false,char[48],char[17],unsigned_int>
                (false,"AttachToFramebuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/Texture2D_GL.cpp"
                 ,0x123,(char (*) [48])"Failed to attach texture 2D to read framebuffer",
                 (char (*) [17])"\nGL Error Code: ",&local_54);
      FormatString<char[6]>(&local_50,(char (*) [6])0x731c01);
      DebugAssertionFailed
                (local_50._M_dataplus._M_p,"AttachToFramebuffer",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/Texture2D_GL.cpp"
                 ,0x123);
      std::__cxx11::string::~string((string *)&local_50);
    }
  }
  return;
}

Assistant:

void Texture2D_GL::AttachToFramebuffer(const TextureViewDesc& ViewDesc, GLenum AttachmentPoint, FRAMEBUFFER_TARGET_FLAGS Targets)
{
    // For glFramebufferTexture2D(), if texture name is not zero, then texture target must be GL_TEXTURE_2D,
    // GL_TEXTURE_RECTANGLE or one of the 6 cubemap face targets GL_TEXTURE_CUBE_MAP_POSITIVE_X, ...
    if (Targets & FRAMEBUFFER_TARGET_FLAG_DRAW)
    {
        VERIFY_EXPR(ViewDesc.ViewType == TEXTURE_VIEW_RENDER_TARGET || ViewDesc.ViewType == TEXTURE_VIEW_DEPTH_STENCIL);
        glFramebufferTexture2D(GL_DRAW_FRAMEBUFFER, AttachmentPoint, m_BindTarget, m_GlTexture, ViewDesc.MostDetailedMip);
        DEV_CHECK_GL_ERROR("Failed to attach texture 2D to draw framebuffer");
    }
    if (Targets & FRAMEBUFFER_TARGET_FLAG_READ)
    {
        glFramebufferTexture2D(GL_READ_FRAMEBUFFER, AttachmentPoint, m_BindTarget, m_GlTexture, ViewDesc.MostDetailedMip);
        DEV_CHECK_GL_ERROR("Failed to attach texture 2D to read framebuffer");
    }
}